

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O3

void mpr_add_n1_node_to_set(avl_tree *set,nhdp_neighbor *neigh,nhdp_link *lnk,uint32_t offset)

{
  undefined8 uVar1;
  avl_node *paVar2;
  undefined8 *puVar3;
  
  paVar2 = avl_find(set,neigh);
  if (paVar2 != (avl_node *)0x0) {
    return;
  }
  puVar3 = (undefined8 *)calloc(1,0x68);
  uVar1 = *(undefined8 *)((neigh->originator)._addr + 8);
  *puVar3 = *(undefined8 *)(neigh->originator)._addr;
  puVar3[1] = uVar1;
  *(undefined2 *)(puVar3 + 2) = *(undefined2 *)&(neigh->originator)._type;
  puVar3[10] = puVar3;
  puVar3[4] = neigh;
  puVar3[3] = lnk;
  *(uint32_t *)(puVar3 + 0xc) = offset;
  avl_insert(set,(avl_node *)(puVar3 + 5));
  return;
}

Assistant:

void
mpr_add_n1_node_to_set(struct avl_tree *set, struct nhdp_neighbor *neigh, struct nhdp_link *lnk, uint32_t offset) {
  struct n1_node *tmp_n1_neigh;
  tmp_n1_neigh = avl_find_element(set, &neigh->originator, tmp_n1_neigh, _avl_node);
  if (tmp_n1_neigh) {
    return;
  }
  tmp_n1_neigh = calloc(1, sizeof(struct n1_node));
  tmp_n1_neigh->addr = neigh->originator;
  tmp_n1_neigh->_avl_node.key = &tmp_n1_neigh->addr;
  tmp_n1_neigh->neigh = neigh;
  tmp_n1_neigh->link = lnk;
  tmp_n1_neigh->table_offset = offset;
  avl_insert(set, &tmp_n1_neigh->_avl_node);
}